

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawSchema * __thiscall
capnp::SchemaLoader::Impl::loadEmpty
          (Impl *this,uint64_t id,StringPtr name,Which kind,bool isPlaceholder)

{
  RawSchema *pRVar1;
  ArrayPtr<capnp::word> firstSegment;
  Builder node;
  Fault f;
  MallocMessageBuilder builder;
  word scratch [32];
  StructBuilder local_2a8;
  Impl *local_280;
  Reader local_278;
  Builder local_240;
  MallocMessageBuilder local_228;
  word local_138 [33];
  
  local_280 = this;
  memset(local_138,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = local_138;
  MallocMessageBuilder::MallocMessageBuilder(&local_228,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_240,&local_228.super_MessageBuilder);
  local_278._reader.data = local_240.builder.pointer;
  local_278._reader.segment = &(local_240.builder.segment)->super_SegmentReader;
  local_278._reader.capTable = &(local_240.builder.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStruct(&local_2a8,(PointerBuilder *)&local_278,(StructSize)0x60006);
  *(uint64_t *)local_2a8.data = id;
  local_278._reader.segment = &(local_2a8.segment)->super_SegmentReader;
  local_278._reader.capTable = &(local_2a8.capTable)->super_CapTableReader;
  local_278._reader.data = local_2a8.pointers;
  capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_278,(Reader)name.content);
  switch(kind) {
  case FILE:
  case CONST:
  case ANNOTATION:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
              ((Fault *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x595,FAILED,(char *)0x0,"\"Not a type.\"",(char (*) [12])"Not a type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_278);
  case STRUCT:
    *(undefined4 *)((long)local_2a8.data + 0xc) = 1;
    *(undefined4 *)((long)local_2a8.data + 0x18) = 0;
    *(byte *)((long)local_2a8.data + 0x1c) = *(byte *)((long)local_2a8.data + 0x1c) & 0xfe;
    *(undefined2 *)((long)local_2a8.data + 0x1e) = 0;
    *(undefined4 *)((long)local_2a8.data + 0x20) = 0;
    local_278._reader.data = local_2a8.pointers + 3;
    local_278._reader.segment = &(local_2a8.segment)->super_SegmentReader;
    local_278._reader.capTable = &(local_2a8.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_278);
    break;
  case ENUM:
    *(undefined2 *)((long)local_2a8.data + 0xc) = 2;
    local_278._reader.data = local_2a8.pointers + 3;
    local_278._reader.segment = &(local_2a8.segment)->super_SegmentReader;
    local_278._reader.capTable = &(local_2a8.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_278);
    break;
  case INTERFACE:
    *(undefined2 *)((long)local_2a8.data + 0xc) = 3;
    local_278._reader.data = local_2a8.pointers + 3;
    local_278._reader.segment = &(local_2a8.segment)->super_SegmentReader;
    local_278._reader.capTable = &(local_2a8.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_278);
    local_278._reader.data = local_2a8.pointers + 4;
    local_278._reader.segment = &(local_2a8.segment)->super_SegmentReader;
    local_278._reader.capTable = &(local_2a8.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_278);
  }
  capnp::_::StructBuilder::asReader(&local_2a8);
  pRVar1 = load(local_280,&local_278,isPlaceholder);
  MallocMessageBuilder::~MallocMessageBuilder(&local_228);
  return pRVar1;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadEmpty(
    uint64_t id, kj::StringPtr name, schema::Node::Which kind, bool isPlaceholder) {
  word scratch[32];
  memset(scratch, 0, sizeof(scratch));
  MallocMessageBuilder builder(scratch);
  auto node = builder.initRoot<schema::Node>();
  node.setId(id);
  node.setDisplayName(name);
  switch (kind) {
    case schema::Node::STRUCT: node.initStruct(); break;
    case schema::Node::ENUM: node.initEnum(); break;
    case schema::Node::INTERFACE: node.initInterface(); break;

    case schema::Node::FILE:
    case schema::Node::CONST:
    case schema::Node::ANNOTATION:
      KJ_FAIL_REQUIRE("Not a type.");
      break;
  }

  return load(node, isPlaceholder);
}